

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

void iniparser_dumpsection_ini(dictionary *d,char *s,FILE *f)

{
  int iVar1;
  size_t sVar2;
  char *local_458;
  char local_438 [4];
  int seclen;
  char keym [1025];
  ulong local_28;
  size_t j;
  FILE *f_local;
  char *s_local;
  dictionary *d_local;
  
  if (((d != (dictionary *)0x0) && (f != (FILE *)0x0)) &&
     (iVar1 = iniparser_find_entry(d,s), iVar1 != 0)) {
    sVar2 = strlen(s);
    fprintf((FILE *)f,"\n[%s]\n",s);
    sprintf(local_438,"%s:",s);
    for (local_28 = 0; local_28 < (ulong)d->size; local_28 = local_28 + 1) {
      if ((d->key[local_28] != (char *)0x0) &&
         (iVar1 = strncmp(d->key[local_28],local_438,(long)((int)sVar2 + 1)), iVar1 == 0)) {
        if (d->val[local_28] == (char *)0x0) {
          local_458 = "";
        }
        else {
          local_458 = d->val[local_28];
        }
        fprintf((FILE *)f,"%-30s = %s\n",d->key[local_28] + (long)(int)sVar2 + 1,local_458);
      }
    }
    fprintf((FILE *)f,"\n");
  }
  return;
}

Assistant:

void iniparser_dumpsection_ini(const dictionary * d, const char * s, FILE * f)
{
    size_t  j ;
    char    keym[ASCIILINESZ+1];
    int     seclen ;

    if (d==NULL || f==NULL) return ;
    if (! iniparser_find_entry(d, s)) return ;

    seclen  = (int)strlen(s);
    fprintf(f, "\n[%s]\n", s);
    sprintf(keym, "%s:", s);
    for (j=0 ; j<d->size ; j++) {
        if (d->key[j]==NULL)
            continue ;
        if (!strncmp(d->key[j], keym, seclen+1)) {
            fprintf(f,
                    "%-30s = %s\n",
                    d->key[j]+seclen+1,
                    d->val[j] ? d->val[j] : "");
        }
    }
    fprintf(f, "\n");
    return ;
}